

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

char * qpdf_oh_get_binary_string_value(qpdf_data qpdf,qpdf_oh oh,size_t *length)

{
  char *pcVar1;
  anon_class_16_2_46c252fe local_78;
  function<const_char_*(QPDFObjectHandle_&)> local_68;
  char *local_48;
  function<const_char_*()> local_40;
  size_t *local_20;
  size_t *length_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_48 = "";
  local_20 = length;
  length_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  return_T<char_const*>(&local_40,&local_48);
  local_78.qpdf = p_Stack_10;
  local_78.length = local_20;
  std::function<char_const*(QPDFObjectHandle&)>::function<qpdf_oh_get_binary_string_value::__0,void>
            ((function<char_const*(QPDFObjectHandle&)> *)&local_68,&local_78);
  pcVar1 = do_with_oh<char_const*>(qpdf,oh,&local_40,&local_68);
  std::function<const_char_*(QPDFObjectHandle_&)>::~function(&local_68);
  std::function<const_char_*()>::~function(&local_40);
  return pcVar1;
}

Assistant:

char const*
qpdf_oh_get_binary_string_value(qpdf_data qpdf, qpdf_oh oh, size_t* length)
{
    return do_with_oh<char const*>(
        qpdf, oh, return_T<char const*>(""), [qpdf, length](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_binary_string_value");
            qpdf->tmp_string = o.getStringValue();
            *length = qpdf->tmp_string.length();
            return qpdf->tmp_string.c_str();
        });
}